

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O3

void __thiscall Storage::Tape::TapePlayer::process_next_event(TapePlayer *this)

{
  element_type *peVar1;
  Observer *pOVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  uint extraout_EDX;
  
  (*(this->super_TimedEventLoop)._vptr_TimedEventLoop[5])(this,&this->current_pulse_);
  peVar1 = (this->tape_).super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    (this->current_pulse_).length.clock_rate = 1;
    (this->current_pulse_).type = Zero;
    (this->current_pulse_).length.length = 1;
  }
  else {
    iVar3 = (*peVar1->_vptr_Tape[7])(peVar1);
    (peVar1->pulse_).type = iVar3;
    (peVar1->pulse_).length.length = extraout_var;
    (peVar1->pulse_).length.clock_rate = extraout_EDX;
    peVar1->offset_ = peVar1->offset_ + 1;
    (this->current_pulse_).type = iVar3;
    (this->current_pulse_).length.length = extraout_var;
    (this->current_pulse_).length.clock_rate = extraout_EDX;
    iVar3 = (**((this->tape_).super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_vptr_Tape)();
    if (((char)iVar3 != '\0') &&
       (pOVar2 = (this->super_Source).observer_, pOVar2 != (Observer *)0x0)) {
      uVar4 = (**(this->super_Source)._vptr_Source)(&this->super_Source);
      (**pOVar2->_vptr_Observer)(pOVar2,&this->super_Source,(ulong)uVar4);
    }
  }
  TimedEventLoop::set_next_event_time_interval
            (&this->super_TimedEventLoop,(this->current_pulse_).length);
  return;
}

Assistant:

void TapePlayer::process_next_event() {
	process_input_pulse(current_pulse_);
	get_next_pulse();
}